

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O2

VmConstant * AllocateHeapArray(InstructionVMEvalContext *ctx,TypeBase *target,uint count)

{
  uint offset;
  Allocator *allocator;
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  TypeUnsizedArray *structType;
  ulong *puVar3;
  unsigned_long_long tmp;
  VmType type;
  VmConstant *this;
  undefined4 extraout_var_00;
  
  offset = ctx->heapSize;
  InstructionVMEvalContext::Storage::Reserve(&ctx->heap,ctx,offset,(int)target->size * count);
  uVar1 = (int)target->size * count + ctx->heapSize;
  ctx->heapSize = uVar1;
  if (uVar1 < 0xffff) {
    if (0xffff < offset) {
      __assert_fail("unsigned(pointer & memoryOffsetMask) == pointer",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                    ,0x285,
                    "VmConstant *AllocateHeapArray(InstructionVMEvalContext &, TypeBase *, unsigned int)"
                   );
    }
    uVar1 = GetStorageIndex(ctx,&ctx->heap);
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xd8);
    this = (VmConstant *)CONCAT44(extraout_var,iVar2);
    allocator = ctx->allocator;
    structType = ExpressionContext::GetUnsizedArrayType(ctx->ctx,target);
    type = VmType::ArrayRef((TypeBase *)structType);
    VmConstant::VmConstant(this,allocator,type,(SynBase *)0x0);
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])
                      (ctx->allocator,(ulong)(this->super_VmValue).type.size);
    puVar3 = (ulong *)CONCAT44(extraout_var_00,iVar2);
    *puVar3 = (ulong)(uVar1 << 0x10 | offset);
    *(uint *)(puVar3 + 1) = count;
    this->sValue = (char *)puVar3;
  }
  else {
    this = (VmConstant *)0x0;
    anon_unknown.dwarf_116928::Report(ctx,"ERROR: heap limit reached");
  }
  return this;
}

Assistant:

VmConstant* AllocateHeapArray(InstructionVMEvalContext &ctx, TypeBase *target, unsigned count)
{
	unsigned offset = ctx.heapSize;

	ctx.heap.Reserve(ctx, offset, unsigned(target->size) * count);
	ctx.heapSize += unsigned(target->size) * count;

	if(ctx.heapSize >= memoryOffsetMask)
		return (VmConstant*)Report(ctx, "ERROR: heap limit reached");

	unsigned pointer = 0;

	pointer = offset;
	assert(unsigned(pointer & memoryOffsetMask) == pointer);
	pointer |= GetStorageIndex(ctx, &ctx.heap) << memoryStorageBits;

	VmConstant *result = new (ctx.get<VmConstant>()) VmConstant(ctx.allocator, VmType::ArrayRef(ctx.ctx.GetUnsizedArrayType(target)), NULL);

	char *storage = (char*)ctx.allocator->alloc(result->type.size);

	if(sizeof(void*) == 4)
	{
		memcpy(storage, &pointer, 4);
	}
	else
	{
		unsigned long long tmp = pointer;
		memcpy(storage, &tmp, 8);
	}

	memcpy(storage + sizeof(void*), &count, 4);

	result->sValue = storage;

	return result;
}